

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O1

int main(void)

{
  int iVar1;
  CMUnitTest tests [10];
  CMUnitTest aCStack_198 [10];
  
  memcpy(aCStack_198,&PTR_anon_var_dwarf_3f_00118c40,400);
  iVar1 = _cmocka_run_group_tests
                    ("tests",aCStack_198,10,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar1;
}

Assistant:

int main() {
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(hamming_test),
        cmocka_unit_test(test_bitset_lenrange_cardinality),
        cmocka_unit_test(printf_test),
        cmocka_unit_test(set_get_test),
        cmocka_unit_test(and_or_test),
        cmocka_unit_test(xor_test),
        cmocka_unit_test(andnot_test),
        cmocka_unit_test(to_uint32_array_test),
        cmocka_unit_test(select_test),
        cmocka_unit_test(test_bitset_compute_cardinality),
    };

    return cmocka_run_group_tests(tests, NULL, NULL);
}